

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen2_2x3.cpp
# Opt level: O2

size_t Assimp::STEP::GenericFill<Assimp::IFC::Schema_2x3::IfcElementQuantity>
                 (DB *db,LIST *params,IfcElementQuantity *in)

{
  size_t sVar1;
  long lVar2;
  TypeError *this;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg;
  string local_70;
  allocator<char> local_50 [32];
  
  sVar1 = GenericFill<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>
                    (db,params,&in->super_IfcPropertySetDefinition);
  if (0x5f < (ulong)((long)(params->members).
                           super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(params->members).
                          super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    EXPRESS::LIST::operator[]((LIST *)&arg,(size_t)params);
    lVar2 = __dynamic_cast(arg.
                           super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,&EXPRESS::DataType::typeinfo,&EXPRESS::UNSET::typeinfo,0);
    if (lVar2 == 0) {
      GenericConvert<Assimp::STEP::Maybe<std::__cxx11::string>>
                ((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&(in->super_IfcPropertySetDefinition).field_0xb8,&arg,db);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&arg.
                super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    EXPRESS::LIST::operator[]((LIST *)&arg,(size_t)params);
    GenericConvert<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,1ul,0ul>
              (&in->Quantities,&arg,db);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&arg.
                super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    return sVar1 + 2;
  }
  this = (TypeError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"expected 6 arguments to IfcElementQuantity",local_50);
  TypeError::TypeError(this,&local_70,0xffffffffffffffff,0xffffffffffffffff);
  __cxa_throw(this,&TypeError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t GenericFill<IfcElementQuantity>(const DB& db, const LIST& params, IfcElementQuantity* in)
{
	size_t base = GenericFill(db,params,static_cast<IfcPropertySetDefinition*>(in));
	if (params.GetSize() < 6) { throw STEP::TypeError("expected 6 arguments to IfcElementQuantity"); }    do { // convert the 'MethodOfMeasurement' argument
        std::shared_ptr<const DataType> arg = params[base++];
        if (dynamic_cast<const UNSET*>(&*arg)) break;
        try { GenericConvert( in->MethodOfMeasurement, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 4 to IfcElementQuantity to be a `IfcLabel`")); }
    } while(0);
    do { // convert the 'Quantities' argument
        std::shared_ptr<const DataType> arg = params[base++];
        try { GenericConvert( in->Quantities, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 5 to IfcElementQuantity to be a `SET [1:?] OF IfcPhysicalQuantity`")); }
    } while(0);
	return base;
}